

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_comparison_join.cpp
# Opt level: O1

InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
duckdb::LogicalComparisonJoin::ParamsToString_abi_cxx11_
          (InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,LogicalComparisonJoin *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  const_reference this_00;
  pointer pEVar4;
  BoundComparisonExpression *this_01;
  pointer pBVar5;
  pointer pJVar6;
  pointer pJVar7;
  size_type __n;
  string conditions_info;
  templated_unique_single_t expr;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_90;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_88;
  string local_80;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_60;
  undefined1 local_58 [32];
  _Head_base<0UL,_duckdb::BoundComparisonExpression_*,_false> local_38;
  
  (__return_storage_ptr__->map).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->map).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->map).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->map_idx)._M_h._M_buckets =
       &(__return_storage_ptr__->map_idx)._M_h._M_single_bucket;
  (__return_storage_ptr__->map_idx)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->map_idx)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->map_idx)._M_h._M_element_count = 0;
  (__return_storage_ptr__->map_idx)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->map_idx)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->map_idx)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  __s = EnumUtil::ToChars<duckdb::JoinType>
                  ((this->super_LogicalJoin).super_LogicalOperator.field_0x61);
  paVar1 = &local_80.field_2;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Join Type","");
  pbVar3 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](__return_storage_ptr__,&local_80);
  pcVar2 = (char *)pbVar3->_M_string_length;
  strlen(__s);
  ::std::__cxx11::string::_M_replace((ulong)pbVar3,0,pcVar2,(ulong)__s);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  pJVar6 = (this->conditions).
           super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
           super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
           .super__Vector_impl_data._M_start;
  pJVar7 = (this->conditions).
           super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
           super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
           .super__Vector_impl_data._M_finish;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  if (pJVar7 != pJVar6) {
    __n = 0;
    do {
      if (__n != 0) {
        ::std::__cxx11::string::append((char *)&local_80);
      }
      this_00 = vector<duckdb::JoinCondition,_true>::operator[](&this->conditions,__n);
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(&this_00->left);
      (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_88,pEVar4);
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(&this_00->right);
      (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_90,pEVar4);
      this_01 = (BoundComparisonExpression *)operator_new(0x68);
      local_58._0_8_ = local_88._M_head_impl;
      local_88._M_head_impl = (Expression *)0x0;
      local_60._M_head_impl = local_90._M_head_impl;
      local_90._M_head_impl = (Expression *)0x0;
      BoundComparisonExpression::BoundComparisonExpression
                (this_01,this_00->comparison,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_58,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)&local_60);
      local_38._M_head_impl = this_01;
      if (local_60._M_head_impl != (Expression *)0x0) {
        (*((local_60._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_60._M_head_impl = (Expression *)0x0;
      if ((Expression *)local_58._0_8_ != (Expression *)0x0) {
        (**(code **)(*(long *)local_58._0_8_ + 8))();
      }
      if (local_90._M_head_impl != (Expression *)0x0) {
        (*((local_90._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      if (local_88._M_head_impl != (Expression *)0x0) {
        (*((local_88._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      pBVar5 = unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>,_true>
               ::operator->((unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>,_true>
                             *)&local_38);
      (*(pBVar5->super_Expression).super_BaseExpression._vptr_BaseExpression[8])
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_58,pBVar5);
      ::std::__cxx11::string::_M_append((char *)&local_80,local_58._0_8_);
      if ((Expression *)local_58._0_8_ != (Expression *)(local_58 + 0x10)) {
        operator_delete((void *)local_58._0_8_);
      }
      if (local_38._M_head_impl != (BoundComparisonExpression *)0x0) {
        (*((local_38._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])
                  ();
      }
      __n = __n + 1;
      pJVar6 = (this->conditions).
               super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
               super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pJVar7 = (this->conditions).
               super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
               super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    } while (__n < (ulong)(((long)pJVar7 - (long)pJVar6 >> 3) * -0x5555555555555555));
  }
  if ((this->predicate).
      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
    if (pJVar6 != pJVar7) {
      ::std::__cxx11::string::append((char *)&local_80);
    }
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(&this->predicate);
    (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[8])(local_58,pEVar4);
    ::std::__cxx11::string::_M_append((char *)&local_80,local_58._0_8_);
    if (local_58._0_8_ != (long)local_58 + 0x10) {
      operator_delete((void *)local_58._0_8_);
    }
  }
  local_58._0_8_ = (Expression *)(local_58 + 0x10);
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Conditions","");
  pbVar3 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](__return_storage_ptr__,(string *)local_58);
  ::std::__cxx11::string::_M_assign((string *)pbVar3);
  if ((Expression *)local_58._0_8_ != (Expression *)(local_58 + 0x10)) {
    operator_delete((void *)local_58._0_8_);
  }
  LogicalOperator::SetParamsEstimatedCardinality((LogicalOperator *)this,__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

InsertionOrderPreservingMap<string> LogicalComparisonJoin::ParamsToString() const {
	InsertionOrderPreservingMap<string> result;
	result["Join Type"] = EnumUtil::ToChars(join_type);

	string conditions_info;
	for (idx_t i = 0; i < conditions.size(); i++) {
		if (i > 0) {
			conditions_info += "\n";
		}
		auto &condition = conditions[i];
		auto expr =
		    make_uniq<BoundComparisonExpression>(condition.comparison, condition.left->Copy(), condition.right->Copy());
		conditions_info += expr->ToString();
	}
	if (predicate) {
		if (!conditions.empty()) {
			conditions_info += "\n";
		}
		conditions_info += predicate->ToString();
	}
	result["Conditions"] = conditions_info;
	SetParamsEstimatedCardinality(result);

	return result;
}